

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Alchitry_Loader.cpp
# Opt level: O0

string * getErrorName_abi_cxx11_(uint error)

{
  undefined4 in_ESI;
  undefined4 in_register_0000003c;
  string *this;
  allocator local_38;
  allocator local_37;
  allocator local_36;
  allocator local_35;
  allocator local_34;
  allocator local_33;
  allocator local_32;
  allocator local_31;
  allocator local_30;
  allocator local_2f;
  allocator local_2e;
  allocator local_2d;
  allocator local_2c;
  allocator local_2b;
  allocator local_2a;
  allocator local_29;
  allocator local_28;
  allocator local_27;
  allocator local_26;
  allocator local_25 [16];
  allocator local_15 [5];
  string *psStack_10;
  uint error_local;
  
  this = (string *)CONCAT44(in_register_0000003c,error);
  psStack_10 = this;
  switch(in_ESI) {
  case 0:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"FT_OK",local_15);
    std::allocator<char>::~allocator((allocator<char> *)local_15);
    break;
  case 1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"FT_INVALID_HANDLE",local_25);
    std::allocator<char>::~allocator((allocator<char> *)local_25);
    break;
  case 2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"FT_DEVICE_NOT_FOUND",&local_26);
    std::allocator<char>::~allocator((allocator<char> *)&local_26);
    break;
  case 3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"FT_DEVICE_NOT_OPENED",&local_27);
    std::allocator<char>::~allocator((allocator<char> *)&local_27);
    break;
  case 4:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"FT_IO_ERROR",&local_28);
    std::allocator<char>::~allocator((allocator<char> *)&local_28);
    break;
  case 5:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"FT_INSUFFICIENT_RESOURCES",&local_29);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
    break;
  case 6:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"FT_INVALID_PARAMETER",&local_2a);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a);
    break;
  case 7:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"FT_INVALID_BAUD_RATE",&local_2b);
    std::allocator<char>::~allocator((allocator<char> *)&local_2b);
    break;
  case 8:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"FT_DEVICE_NOT_OPENED_FOR_ERASE",&local_2c);
    std::allocator<char>::~allocator((allocator<char> *)&local_2c);
    break;
  case 9:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"FT_DEVICE_NOT_OPENED_FOR_WRITE",&local_2d);
    std::allocator<char>::~allocator((allocator<char> *)&local_2d);
    break;
  case 10:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"FT_FAILED_TO_WRITE_DEVICE",&local_2e);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e);
    break;
  case 0xb:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"FT_EEPROM_READ_FAILED",&local_2f);
    std::allocator<char>::~allocator((allocator<char> *)&local_2f);
    break;
  case 0xc:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"FT_EEPROM_WRITE_FAILED",&local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_30);
    break;
  case 0xd:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"FT_EEPROM_ERASE_FAILED",&local_31);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
    break;
  case 0xe:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"FT_EEPROM_NOT_PRESENT",&local_32);
    std::allocator<char>::~allocator((allocator<char> *)&local_32);
    break;
  case 0xf:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"FT_EEPROM_NOT_PROGRAMMED",&local_33);
    std::allocator<char>::~allocator((allocator<char> *)&local_33);
    break;
  case 0x10:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"FT_INVALID_ARGS",&local_34);
    std::allocator<char>::~allocator((allocator<char> *)&local_34);
    break;
  case 0x11:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"FT_NOT_SUPPORTED",&local_35);
    std::allocator<char>::~allocator((allocator<char> *)&local_35);
    break;
  case 0x12:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"FT_OTHER_ERROR",&local_36);
    std::allocator<char>::~allocator((allocator<char> *)&local_36);
    break;
  case 0x13:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"FT_DEVICE_LIST_NOT_READY",&local_37);
    std::allocator<char>::~allocator((allocator<char> *)&local_37);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"Unknown",&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_38);
  }
  return this;
}

Assistant:

string getErrorName(unsigned int error) {
    switch (error) {
        case FT_OK:
            return "FT_OK";
        case FT_INVALID_HANDLE:
            return "FT_INVALID_HANDLE";
        case FT_DEVICE_NOT_FOUND:
            return "FT_DEVICE_NOT_FOUND";
        case FT_DEVICE_NOT_OPENED:
            return "FT_DEVICE_NOT_OPENED";
        case FT_IO_ERROR:
            return "FT_IO_ERROR";
        case FT_INSUFFICIENT_RESOURCES:
            return "FT_INSUFFICIENT_RESOURCES";
        case FT_INVALID_PARAMETER:
            return "FT_INVALID_PARAMETER";
        case FT_INVALID_BAUD_RATE:
            return "FT_INVALID_BAUD_RATE";

        case FT_DEVICE_NOT_OPENED_FOR_ERASE:
            return "FT_DEVICE_NOT_OPENED_FOR_ERASE";
        case FT_DEVICE_NOT_OPENED_FOR_WRITE:
            return "FT_DEVICE_NOT_OPENED_FOR_WRITE";
        case FT_FAILED_TO_WRITE_DEVICE:
            return "FT_FAILED_TO_WRITE_DEVICE";
        case FT_EEPROM_READ_FAILED:
            return "FT_EEPROM_READ_FAILED";
        case FT_EEPROM_WRITE_FAILED:
            return "FT_EEPROM_WRITE_FAILED";
        case FT_EEPROM_ERASE_FAILED:
            return "FT_EEPROM_ERASE_FAILED";
        case FT_EEPROM_NOT_PRESENT:
            return "FT_EEPROM_NOT_PRESENT";
        case FT_EEPROM_NOT_PROGRAMMED:
            return "FT_EEPROM_NOT_PROGRAMMED";
        case FT_INVALID_ARGS:
            return "FT_INVALID_ARGS";
        case FT_NOT_SUPPORTED:
            return "FT_NOT_SUPPORTED";
        case FT_OTHER_ERROR:
            return "FT_OTHER_ERROR";
        case FT_DEVICE_LIST_NOT_READY:
            return "FT_DEVICE_LIST_NOT_READY";
        default:
            return "Unknown";
    }
}